

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

int detect_flash(TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,int offset)

{
  double *pdVar1;
  double dVar2;
  ulong uVar3;
  
  if (offset < 0) {
    uVar3 = (ulong)offset;
    if (uVar3 * 0xe8 + (long)twopass_frame < *(ulong *)twopass) {
      return 0;
    }
  }
  else {
    uVar3 = (ulong)(uint)offset;
    if (twopass->frame_stats_arr[0] <= (FIRSTPASS_STATS *)(uVar3 * 0xe8 + (long)twopass_frame)) {
      return 0;
    }
  }
  if ((twopass_frame != (TWO_PASS_FRAME *)0x0) &&
     (dVar2 = *(double *)((long)twopass_frame + uVar3 * 0xe8 + 0x40),
     pdVar1 = (double *)((long)twopass_frame + uVar3 * 0xe8 + 0x30),
     *pdVar1 <= dVar2 && dVar2 != *pdVar1)) {
    return (int)(0.5 <= dVar2);
  }
  return 0;
}

Assistant:

static int detect_flash(const TWO_PASS *twopass,
                        const TWO_PASS_FRAME *twopass_frame, const int offset) {
  const FIRSTPASS_STATS *const next_frame =
      read_frame_stats(twopass, twopass_frame, offset);

  // What we are looking for here is a situation where there is a
  // brief break in prediction (such as a flash) but subsequent frames
  // are reasonably well predicted by an earlier (pre flash) frame.
  // The recovery after a flash is indicated by a high pcnt_second_ref
  // compared to pcnt_inter.
  return next_frame != NULL &&
         next_frame->pcnt_second_ref > next_frame->pcnt_inter &&
         next_frame->pcnt_second_ref >= 0.5;
}